

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_destroy_stream(nghttp2_session *session,nghttp2_stream *stream)

{
  int iVar1;
  
  iVar1 = nghttp2_stream_in_dep_tree(stream);
  if ((iVar1 != 0) && (iVar1 = nghttp2_stream_dep_remove(stream), iVar1 != 0)) {
    return iVar1;
  }
  if ((stream->queued != '\0') && ((stream->flags & 0x10) != 0)) {
    session_ob_data_remove(session,stream);
  }
  nghttp2_map_remove(&session->streams,stream->stream_id);
  nghttp2_stream_free(stream);
  nghttp2_mem_free(&session->mem,stream);
  return 0;
}

Assistant:

int nghttp2_session_destroy_stream(nghttp2_session *session,
                                   nghttp2_stream *stream) {
  nghttp2_mem *mem;
  int rv;

  DEBUGF("stream: destroy closed stream(%p)=%d\n", stream, stream->stream_id);

  mem = &session->mem;

  if (nghttp2_stream_in_dep_tree(stream)) {
    rv = nghttp2_stream_dep_remove(stream);
    if (rv != 0) {
      return rv;
    }
  }

  if (stream->queued &&
      (stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES)) {
    session_ob_data_remove(session, stream);
  }

  nghttp2_map_remove(&session->streams, stream->stream_id);
  nghttp2_stream_free(stream);
  nghttp2_mem_free(mem, stream);

  return 0;
}